

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::MultiThreadedObjectTest::runThread(MultiThreadedObjectTest *this,TestThread *thread)

{
  Library *pLVar1;
  int iVar2;
  deUint32 err;
  deBool dVar3;
  NotSupportedError *this_00;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  undefined4 local_48;
  uint local_44;
  EGLint attribList [5];
  int local_28;
  uint local_24;
  EGLint configCount;
  EGLint surfaceTypes;
  Library *egl;
  TestThread *thread_local;
  MultiThreadedObjectTest *this_local;
  
  egl = (Library *)thread;
  thread_local = (TestThread *)this;
  _configCount = MultiThreadedTest::getLibrary(&this->super_MultiThreadedTest);
  iVar2 = TestThread::getId((TestThread *)egl);
  if (iVar2 == 0) {
    local_24 = 0;
    if ((this->m_types & TYPE_WINDOW) != 0) {
      local_24 = 4;
    }
    if ((this->m_types & TYPE_PBUFFER) != 0) {
      local_24 = local_24 | 1;
    }
    if ((this->m_types & TYPE_PIXMAP) != 0) {
      local_24 = local_24 | 2;
    }
    local_48 = 0x3033;
    local_44 = local_24;
    attribList[0] = 0x3040;
    attribList[1] = 4;
    attribList[2] = 0x3038;
    do {
      (*_configCount->_vptr_Library[2])
                (_configCount,(this->super_MultiThreadedTest).m_display,&local_48,&this->m_config,1,
                 &local_28);
      err = (*_configCount->_vptr_Library[0x1f])();
      eglu::checkError(err,"chooseConfig(m_display, attribList, &m_config, 1, &configCount)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                       ,0x3ab);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    if (local_28 == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"No usable config found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiThreadTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,(TestThread *)egl);
  if (((((this->m_types & TYPE_SINGLE_WINDOW) == 0) || ((this->m_types & TYPE_PBUFFER) != 0)) ||
      ((this->m_types & TYPE_PIXMAP) != 0)) || ((this->m_types & TYPE_CONTEXT) != 0)) {
    createDestroyObjects(this,(TestThread *)egl,100);
  }
  else {
    iVar2 = TestThread::getId((TestThread *)egl);
    if (iVar2 == 0) {
      createDestroyObjects(this,(TestThread *)egl,1);
    }
  }
  iVar2 = TestThread::getId((TestThread *)egl);
  if (iVar2 == 0) {
    pushObjectsToShared(this,(TestThread *)egl);
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,(TestThread *)egl);
  iVar2 = TestThread::getId((TestThread *)egl);
  if (iVar2 == 1) {
    pushObjectsToShared(this,(TestThread *)egl);
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,(TestThread *)egl);
  querySetSharedObjects(this,(TestThread *)egl,100);
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,(TestThread *)egl);
  iVar2 = TestThread::getId((TestThread *)egl);
  pLVar1 = egl;
  if (iVar2 == 0) {
    sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedPbuffers);
    sVar5 = std::
            vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
            ::size(&this->m_sharedNativePixmaps);
    sVar6 = std::
            vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
            ::size(&this->m_sharedNativeWindows);
    sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedContexts);
    pullObjectsFromShared
              (this,(TestThread *)pLVar1,(int)(sVar4 >> 1),(int)(sVar5 >> 1),(int)(sVar6 >> 1),
               (int)(sVar7 >> 1));
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,(TestThread *)egl);
  iVar2 = TestThread::getId((TestThread *)egl);
  pLVar1 = egl;
  if (iVar2 == 1) {
    sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedPbuffers);
    sVar5 = std::
            vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
            ::size(&this->m_sharedNativePixmaps);
    sVar6 = std::
            vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
            ::size(&this->m_sharedNativeWindows);
    sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_sharedContexts);
    pullObjectsFromShared(this,(TestThread *)pLVar1,(int)sVar4,(int)sVar5,(int)sVar6,(int)sVar7);
  }
  MultiThreadedTest::barrier(&this->super_MultiThreadedTest,(TestThread *)egl);
  if ((this->m_types & TYPE_SINGLE_WINDOW) == 0) {
    createDestroyObjects(this,(TestThread *)egl,100);
  }
  destroyObjects(this,(TestThread *)egl);
  return true;
}

Assistant:

bool MultiThreadedObjectTest::runThread (TestThread& thread)
{
	const Library&		egl		= getLibrary();

	if (thread.getId() == 0)
	{
		EGLint surfaceTypes = 0;

		if ((m_types & TYPE_WINDOW) != 0)
			surfaceTypes |= EGL_WINDOW_BIT;

		if ((m_types & TYPE_PBUFFER) != 0)
			surfaceTypes |= EGL_PBUFFER_BIT;

		if ((m_types & TYPE_PIXMAP) != 0)
			surfaceTypes |= EGL_PIXMAP_BIT;

		EGLint configCount;
		EGLint attribList[] =
		{
			EGL_SURFACE_TYPE, surfaceTypes,
			EGL_RENDERABLE_TYPE, EGL_OPENGL_ES2_BIT,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, chooseConfig(m_display, attribList, &m_config, 1, &configCount));

		if (configCount == 0)
			TCU_THROW(NotSupportedError, "No usable config found");
	}

	barrier(thread);

	// Create / Destroy Objects
	if ((m_types & TYPE_SINGLE_WINDOW) != 0 && (m_types & TYPE_PBUFFER) == 0 && (m_types & TYPE_PIXMAP) == 0 && (m_types & TYPE_CONTEXT) == 0)
	{
		if (thread.getId() == 0)
			createDestroyObjects(thread, 1);
	}
	else
		createDestroyObjects(thread, 100);

	// Push first threads objects to shared
	if (thread.getId() == 0)
		pushObjectsToShared(thread);

	barrier(thread);

	// Push second threads objects to shared
	if (thread.getId() == 1)
		pushObjectsToShared(thread);

	barrier(thread);

	// Make queries from shared surfaces
	querySetSharedObjects(thread, 100);

	barrier(thread);

	// Pull surfaces for first thread from shared surfaces
	if (thread.getId() == 0)
		pullObjectsFromShared(thread, (int)(m_sharedPbuffers.size()/2), (int)(m_sharedNativePixmaps.size()/2), (int)(m_sharedNativeWindows.size()/2), (int)(m_sharedContexts.size()/2));

	barrier(thread);

	// Pull surfaces for second thread from shared surfaces
	if (thread.getId() == 1)
		pullObjectsFromShared(thread, (int)m_sharedPbuffers.size(), (int)m_sharedNativePixmaps.size(), (int)m_sharedNativeWindows.size(), (int)m_sharedContexts.size());

	barrier(thread);

	// Create / Destroy Objects
	if ((m_types & TYPE_SINGLE_WINDOW) == 0)
		createDestroyObjects(thread, 100);

	// Destroy surfaces
	destroyObjects(thread);

	return true;
}